

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O0

void av1_highbd_quantize_fp_facade
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,MACROBLOCK_PLANE *p,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,uint16_t *eob_ptr,SCAN_ORDER *sc,QUANT_PARAM *qparam)

{
  tran_low_t *qcoeff_ptr_00;
  tran_low_t *eob_ptr_00;
  tran_low_t *in_RCX;
  long in_RDX;
  intptr_t in_RSI;
  tran_low_t *in_RDI;
  tran_low_t *in_R8;
  uint16_t *in_R9;
  undefined8 *in_stack_00000008;
  int *in_stack_00000010;
  qm_val_t *iqm_ptr;
  qm_val_t *qm_ptr;
  undefined4 in_stack_ffffffffffffff8c;
  
  qcoeff_ptr_00 = *(tran_low_t **)(in_stack_00000010 + 2);
  eob_ptr_00 = *(tran_low_t **)(in_stack_00000010 + 4);
  if ((qcoeff_ptr_00 == (tran_low_t *)0x0) || (eob_ptr_00 == (tran_low_t *)0x0)) {
    (*av1_highbd_quantize_fp)
              (in_RDI,in_RSI,*(int16_t **)(in_RDX + 0x78),*(int16_t **)(in_RDX + 0x58),
               *(int16_t **)(in_RDX + 0x50),*(int16_t **)(in_RDX + 0x70),in_RCX,in_R8,
               *(int16_t **)(in_RDX + 0x80),in_R9,(int16_t *)*in_stack_00000008,
               (int16_t *)in_stack_00000008[1],*in_stack_00000010);
  }
  else {
    highbd_quantize_fp_helper_c
              ((tran_low_t *)*in_stack_00000008,(intptr_t)in_R9,*(int16_t **)(in_RDX + 0x80),
               (int16_t *)in_R8,(int16_t *)in_RCX,(int16_t *)0x1e1bb3,qcoeff_ptr_00,eob_ptr_00,
               (int16_t *)CONCAT44(in_stack_ffffffffffffff8c,*in_stack_00000010),
               (uint16_t *)eob_ptr_00,(int16_t *)qcoeff_ptr_00,(int16_t *)in_R9,(qm_val_t *)in_R8,
               (qm_val_t *)in_RCX,(int)in_RDX);
  }
  return;
}

Assistant:

void av1_highbd_quantize_fp_facade(const tran_low_t *coeff_ptr,
                                   intptr_t n_coeffs, const MACROBLOCK_PLANE *p,
                                   tran_low_t *qcoeff_ptr,
                                   tran_low_t *dqcoeff_ptr, uint16_t *eob_ptr,
                                   const SCAN_ORDER *sc,
                                   const QUANT_PARAM *qparam) {
  const qm_val_t *qm_ptr = qparam->qmatrix;
  const qm_val_t *iqm_ptr = qparam->iqmatrix;
  if (qm_ptr != NULL && iqm_ptr != NULL) {
    highbd_quantize_fp_helper_c(
        coeff_ptr, n_coeffs, p->zbin_QTX, p->round_fp_QTX, p->quant_fp_QTX,
        p->quant_shift_QTX, qcoeff_ptr, dqcoeff_ptr, p->dequant_QTX, eob_ptr,
        sc->scan, sc->iscan, qm_ptr, iqm_ptr, qparam->log_scale);
  } else {
    av1_highbd_quantize_fp(coeff_ptr, n_coeffs, p->zbin_QTX, p->round_fp_QTX,
                           p->quant_fp_QTX, p->quant_shift_QTX, qcoeff_ptr,
                           dqcoeff_ptr, p->dequant_QTX, eob_ptr, sc->scan,
                           sc->iscan, qparam->log_scale);
  }
}